

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFA<wchar_t>::parse_selection(NFA<wchar_t> *this,Stream *stream,wchar_t ch)

{
  wchar_t ch_00;
  fd_set *in_RCX;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  undefined1 local_40 [8];
  NFA<wchar_t> nfa;
  wchar_t ch_local;
  Stream *stream_local;
  NFA<wchar_t> *this_local;
  
  nfa.super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states.
  super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ch;
  parse_unit(this,stream,ch);
  while( true ) {
    nfa.super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states.
    super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Stream::peek(stream);
    if (nfa.super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states.
        super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != L'|') break;
    Stream::discard(stream);
    NFA((NFA<wchar_t> *)local_40);
    ch_00 = Stream::get(stream);
    parse_unit((NFA<wchar_t> *)local_40,stream,ch_00);
    select(this,(int)local_40,__readfds,in_RCX,in_R8,in_R9);
    ~NFA((NFA<wchar_t> *)local_40);
  }
  return;
}

Assistant:

void parse_selection(Stream& stream, wchar_t ch)
    {
        parse_unit(stream, ch);

        while (true)
        {
            ch = stream.peek();

            if (ch != L'|')
            {
                break;
            }

            stream.discard();

            NFA<TCHAR> nfa;
            nfa.parse_unit(stream, stream.get());
            select(nfa);
        }
    }